

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeCommandListAppendMemoryFill
          (ze_command_list_handle_t hCommandList,void *ptr,void *pattern,size_t pattern_size,
          size_t size,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ze_result_t unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_b4;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = context;
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeCommandListAppendMemoryFill(hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEventsLocal)"
             ,"");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar3 + 0x260);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd30);
    lVar3 = *(long *)(lVar3 + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    local_b4 = unaff_EBP;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        local_b4 = (**(code **)(*plVar4 + 0x330))
                             (plVar4,hCommandList,ptr,pattern,pattern_size,size,hSignalEvent,
                              numWaitEvents,phWaitEvents);
        if (local_b4 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryFill",local_b4);
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
        local_b4 = unaff_EBP;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    if (bVar9) {
      return local_b4;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZEHandleLifetimeValidation::zeCommandListAppendMemoryFillPrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hCommandList,ptr,
                           pattern,pattern_size,size,hSignalEvent,numWaitEvents,phWaitEvents),
       zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeCommandListAppendMemoryFill",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hCommandList,ptr,pattern,pattern_size,size,hSignalEvent,numWaitEvents,
                      phWaitEvents);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8);
        result = (**(code **)(*plVar4 + 0x338))
                           (plVar4,hCommandList,ptr,pattern,pattern_size,size,hSignalEvent,
                            numWaitEvents,phWaitEvents,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListAppendMemoryFill",result);
          local_b4 = result;
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return local_b4;
    }
  }
  logAndPropagateResult("zeCommandListAppendMemoryFill",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryFill(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* ptr,                                      ///< [in] pointer to memory to initialize
        const void* pattern,                            ///< [in] pointer to value to initialize memory to
        size_t pattern_size,                            ///< [in] size in bytes of the value to initialize memory to
        size_t size,                                    ///< [in] size in bytes to initialize
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        context.logger->log_trace("zeCommandListAppendMemoryFill(hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEventsLocal)");

        auto pfnAppendMemoryFill = context.zeDdiTable.CommandList.pfnAppendMemoryFill;

        if( nullptr == pfnAppendMemoryFill )
            return logAndPropagateResult("zeCommandListAppendMemoryFill", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryFillPrologue( hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryFill", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendMemoryFillPrologue( hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryFill", result);
        }

        auto driver_result = pfnAppendMemoryFill( hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEvents );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryFillEpilogue( hCommandList, ptr, pattern, pattern_size, size, hSignalEvent, numWaitEvents, phWaitEvents ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryFill", result);
        }

        return logAndPropagateResult("zeCommandListAppendMemoryFill", driver_result);
    }